

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallfs(void *func,char *buffer,size_t size,void *allocator)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s;
  size_t sVar4;
  function_return v;
  type ptVar5;
  value pvVar6;
  void *v_00;
  value *ppvVar7;
  void *pvVar8;
  size_t sVar9;
  void *args [16];
  void *local_b8 [17];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    if (buffer == (char *)0x0 || size == 0) {
      sVar4 = signature_count(s);
      if (sVar4 == 0) {
        v = function_call((function_conflict)func,metacall_null_args,0);
        if (v == (function_return)0x0) {
          return (void *)0x0;
        }
        ptVar5 = signature_get_return(s);
        if (ptVar5 == (type)0x0) {
          return v;
        }
        tVar1 = type_index(ptVar5);
        tVar2 = value_type_id(v);
        if (tVar1 == tVar2) {
          return v;
        }
        pvVar6 = value_type_cast(v,tVar1);
        if (pvVar6 == (value)0x0) {
          return v;
        }
        return pvVar6;
      }
    }
    else {
      v_00 = metacall_deserialize("rapid_json",buffer,size,allocator);
      if (v_00 != (void *)0x0) {
        tVar1 = value_type_id(v_00);
        iVar3 = type_id_array(tVar1);
        if (iVar3 == 0) {
          sVar4 = value_type_count(v_00);
          ppvVar7 = value_to_array(v_00);
          for (sVar9 = 0; sVar4 != sVar9; sVar9 = sVar9 + 1) {
            pvVar8 = metacall_value_copy(ppvVar7[sVar9]);
            local_b8[sVar9] = pvVar8;
          }
          pvVar8 = metacallfv_s(func,local_b8,sVar4);
          for (sVar9 = 0; sVar4 != sVar9; sVar9 = sVar9 + 1) {
            value_type_destroy(local_b8[sVar9]);
          }
          value_type_destroy(v_00);
          if (pvVar8 != (void *)0x0) {
            ptVar5 = signature_get_return(s);
            if (ptVar5 == (type)0x0) {
              return pvVar8;
            }
            tVar1 = type_index(ptVar5);
            tVar2 = value_type_id(pvVar8);
            if (tVar1 == tVar2) {
              return pvVar8;
            }
            pvVar6 = value_type_cast(pvVar8,tVar1);
            if (pvVar6 == (value)0x0) {
              return pvVar8;
            }
            return pvVar6;
          }
        }
        else {
          value_type_destroy(v_00);
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfs(void *func, const char *buffer, size_t size, void *allocator)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_call(f, metacall_null_args, 0);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *args[METACALL_ARGS_SIZE];

			value *v_array, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_array(value_type_id(v)) != 0)
			{
				value_type_destroy(v);

				return NULL;
			}

			args_count = value_type_count(v);

			v_array = value_to_array(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				/* This step is necessary in order to handle type castings */
				args[iterator] = metacall_value_copy(v_array[iterator]);
			}

			ret = metacallfv_s(f, args, args_count);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(args[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}